

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visit(wasm::Expression*,wasm::IString_
          (void *this,Expression *curr,IString nextResult)

{
  char **ppcVar1;
  Id IVar2;
  _Rb_tree_color _Var3;
  iterator __position;
  pointer pSVar4;
  uint *puVar5;
  pointer ppEVar6;
  uintptr_t uVar7;
  _Base_ptr p_Var8;
  ValueBuilder *pVVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Name name;
  Name name_00;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  char *pcVar15;
  ValueBuilder *this_00;
  size_t sVar16;
  size_t sVar17;
  char *pcVar18;
  Module *pMVar19;
  size_t sVar20;
  undefined1 auVar21 [8];
  int iVar22;
  Index IVar23;
  JsType JVar24;
  uint uVar25;
  Value *pVVar26;
  mapped_type *pmVar27;
  size_t *psVar28;
  long lVar29;
  undefined8 uVar30;
  size_type sVar31;
  Ref RVar32;
  Value *this_01;
  Ref RVar33;
  const_iterator cVar34;
  _Rb_tree_node_base *p_Var35;
  undefined1 (*pauVar36) [16];
  ArrayStorage *pAVar37;
  NameScope scope;
  pointer pSVar38;
  uint *puVar39;
  long lVar40;
  char *pcVar41;
  long lVar42;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  char *extraout_RDX_02;
  undefined8 *puVar44;
  _Base_ptr p_Var45;
  JsSign JVar46;
  Type TVar47;
  void *pvVar48;
  Expression *pEVar49;
  Module *pMVar50;
  Wasm2JSBuilder *this_02;
  wasm2js *pwVar51;
  Ref in_R8;
  Ref in_R9;
  pointer ppEVar52;
  size_t sVar53;
  bool bVar54;
  undefined8 uVar55;
  ulong uVar56;
  ValueBuilder *this_03;
  bool bVar57;
  IString specific;
  IString nextResult_00;
  IString nextResult_01;
  IString nextResult_02;
  IString nextResult_03;
  IString specific_00;
  IString nextResult_04;
  IString nextResult_05;
  IString nextResult_06;
  IString nextResult_07;
  IString nextResult_08;
  IString nextResult_09;
  IString nextResult_10;
  IString nextResult_11;
  IString nextResult_12;
  IString nextResult_13;
  IString nextResult_14;
  IString nextResult_15;
  IString nextResult_16;
  IString specific_01;
  IString nextResult_17;
  IString nextResult_18;
  IString nextResult_19;
  IString specific_02;
  IString nextResult_20;
  IString specific_03;
  IString nextResult_21;
  IString nextResult_22;
  IString specific_04;
  IString nextResult_23;
  IString nextResult_24;
  IString nextResult_25;
  IString key;
  IString key_00;
  IString nextResult_26;
  IString nextResult_27;
  IString op;
  IString nextResult_28;
  IString specific_05;
  IString nextResult_29;
  IString nextResult_30;
  IString nextResult_31;
  IString nextResult_32;
  IString nextResult_33;
  IString key_01;
  IString nextResult_34;
  IString nextResult_35;
  IString op_00;
  IString op_01;
  IString key_02;
  IString nextResult_36;
  IString nextResult_37;
  IString nextResult_38;
  IString nextResult_39;
  IString nextResult_40;
  IString op_02;
  IString specific_06;
  IString specific_07;
  IString nextResult_41;
  IString nextResult_42;
  IString op_03;
  IString nextResult_43;
  IString nextResult_44;
  IString nextResult_45;
  IString specific_08;
  IString nextResult_46;
  IString nextResult_47;
  IString nextResult_48;
  IString op_04;
  IString op_05;
  IString target;
  IString target_00;
  IString op_06;
  IString target_01;
  IString target_02;
  IString target_03;
  IString target_04;
  Name name_01;
  IString name_02;
  IString target_05;
  IString label;
  IString name_03;
  IString target_06;
  IString op_07;
  IString target_07;
  IString op_08;
  IString op_09;
  IString target_08;
  IString target_09;
  IString target_10;
  IString target_11;
  IString op_10;
  string_view sVar58;
  IString IVar59;
  Expression EVar60;
  undefined1 auVar61 [16];
  HeapAndPointer HVar62;
  IString IVar63;
  Name name_04;
  Name NVar64;
  Ref args_3;
  IString old;
  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  targetIndexes;
  Name local_d8;
  mapped_type *local_c0;
  undefined1 local_b8 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> emittedTargets;
  SwitchCase *case_;
  Ref local_50;
  Ref local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  char *extraout_RDX;
  size_t sVar43;
  
  IVar59.str._M_str = (Value *)nextResult.str._M_str;
  pcVar41 = (char *)nextResult.str._M_len;
  args_3.inst = *(Value **)((long)this + 8);
  old.str._M_len = *(size_t *)((long)this + 0x10);
  *(char **)((long)this + 8) = pcVar41;
  *(Value **)((long)this + 0x10) = IVar59.str._M_str;
  sVar20 = _getGCData;
  pMVar19 = WASM_MEMORY_GROW;
  pcVar18 = _makeJsCoercedZero;
  sVar17 = cashew::ATOMICS;
  sVar16 = ABI::wasm2js::GET_STASHED_BITS;
  this_00 = cashew::B_NOT;
  pcVar15 = _isalnum;
  sVar14 = FUNCTION_TABLE;
  sVar53 = _str;
  this_03 = cashew::L_NOT;
  IVar63.str._M_str = UINT32ARRAY;
  sVar13 = NULL_;
  sVar12 = __S_eq;
  pVVar9 = cashew::MINUS;
  sVar43 = ABI::wasm2js::TABLE_COPY;
  pMVar50 = MATH_CLZ32;
  if (curr == (Expression *)0x0) {
LAB_00142de7:
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<ExpressionProcessor, cashew::Ref>::visit(Expression *) [SubType = ExpressionProcessor, ReturnType = cashew::Ref]"
                 );
  }
  switch(curr->_id) {
  case BlockId:
    lVar29 = (long)this + 0x180;
    lVar40 = lVar29;
    for (lVar42 = *(long *)((long)this + 0x188); lVar42 != 0;
        lVar42 = *(long *)(lVar42 + 0x10 + (ulong)bVar57 * 8)) {
      bVar57 = *(Expression **)(lVar42 + 0x20) < curr;
      if (!bVar57) {
        lVar40 = lVar42;
      }
    }
    lVar42 = lVar29;
    if ((lVar40 != lVar29) && (lVar42 = lVar40, curr < *(Expression **)(lVar40 + 0x20))) {
      lVar42 = lVar29;
    }
    if (lVar42 == lVar29) {
      IVar59.str._M_str = cashew::ValueBuilder::makeBlock();
      uVar7 = curr[2].type.id;
      if (uVar7 != 0) {
        uVar56 = 0;
        do {
          if (curr[2].type.id <= uVar56) goto LAB_00142e06;
          nextResult_32.str._M_str = (char *)_finalize;
          nextResult_32.str._M_len = (size_t)NO_RESULT;
          RVar32 = IString_(this,*(Expression **)(*(long *)(curr + 2) + uVar56 * 8),nextResult_32);
          flattenAppend(IVar59.str._M_str,RVar32);
          uVar56 = uVar56 + 1;
        } while (uVar7 != uVar56);
      }
      IVar63.str._M_str = (char *)curr[1].type.id;
      if (IVar63.str._M_str != (char *)0x0) {
        RVar32.inst = (Value *)0x3;
        name_01.super_IString.str._M_str = IVar63.str._M_str;
        name_01.super_IString.str._M_len = *(size_t *)(curr + 1);
        IVar63 = fromName(*this,name_01,Label);
        name_02.str._M_str = (char *)IVar59.str._M_str;
        name_02.str._M_len = (size_t)IVar63.str._M_str;
        IVar59.str._M_str =
             cashew::ValueBuilder::makeLabel((ValueBuilder *)IVar63.str._M_len,name_02,RVar32);
      }
      break;
    }
    if (curr[2].type.id == 0) {
LAB_00142e06:
      __assert_fail("index < usedElements",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xbc,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    pEVar49 = (Expression *)**(undefined8 **)(curr + 2);
    IVar59.str._M_str = _finalize;
    pcVar41 = NO_RESULT;
    goto LAB_001417e4;
  case IfId:
    nextResult_14.str._M_str = (char *)cashew::RSHIFT;
    nextResult_14.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = IString_(this,*(Expression **)(curr + 1),nextResult_14);
    nextResult_15.str._M_str = (char *)_finalize;
    nextResult_15.str._M_len = (size_t)NO_RESULT;
    RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_15);
    if (*(Expression **)(curr + 2) == (Expression *)0x0) {
      RVar33.inst = (Value *)0x0;
    }
    else {
      nextResult_16.str._M_str = (char *)_finalize;
      nextResult_16.str._M_len = (size_t)NO_RESULT;
      RVar33 = IString_(this,*(Expression **)(curr + 2),nextResult_16);
    }
    IVar59.str._M_str = cashew::ValueBuilder::makeIf(IVar59.str._M_str,RVar32,RVar33);
    break;
  case LoopId:
    old.str._M_str._0_4_ = *(int *)(curr + 1);
    old.str._M_str._4_4_ = *(undefined4 *)&curr[1].field_0x4;
    targetIndexes._M_t._M_impl._0_4_ = *(undefined4 *)&curr[1].type.id;
    targetIndexes._M_t._M_impl._4_4_ = *(undefined4 *)((long)&curr[1].type.id + 4);
    if (curr[1].type.id != 0) {
      local_b8 = (undefined1  [8])((long)this + 0x1d8);
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_b8,&old.str._M_str);
      IVar59.str._M_str = *(Value **)(curr + 2);
      RVar32 = IString_(this,IVar59.str._M_str,(IString)*(string_view *)((long)this + 8));
      if (*(long *)(*(long *)(curr + 2) + 8) == 0) {
        RVar32 = blockify(cashew::Ref_(RVar32.inst,IVar59.str._M_str);
        name.super_IString.str._M_len._4_4_ = old.str._M_str._4_4_;
        name.super_IString.str._M_len._0_4_ = (int)old.str._M_str;
        name.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
        name.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
        IVar59 = fromName(*this,name,Label);
        label.str._M_str = IVar59.str._M_str;
        label.str._M_len = (size_t)label.str._M_str;
        IVar59.str._M_str = cashew::ValueBuilder::makeBreak((ValueBuilder *)IVar59.str._M_len,label)
        ;
        flattenAppend(RVar32,IVar59.str._M_str);
      }
      else if (*(long *)(*(long *)(curr + 2) + 8) != 1) {
        __assert_fail("curr->body->type == Type::none",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                      ,0x4ab,
                      "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitLoop(Loop *)"
                     );
      }
      pvVar48 = (void *)0x18;
      IVar59.str._M_str = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (IVar59.str._M_str)->type = Null;
      cashew::Value::free(IVar59.str._M_str,pvVar48);
      (IVar59.str._M_str)->type = Number;
      ((IVar59.str._M_str)->field_1).str.str._M_len = 0x3ff0000000000000;
      IVar59.str._M_str = cashew::ValueBuilder::makeWhile(IVar59.str._M_str,RVar32);
      name_00.super_IString.str._M_len._4_4_ = old.str._M_str._4_4_;
      name_00.super_IString.str._M_len._0_4_ = (int)old.str._M_str;
      name_00.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
      name_00.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
      RVar32.inst = (Value *)0x3;
      IVar63 = fromName(*this,name_00,Label);
      name_03.str._M_str = (char *)IVar59.str._M_str;
      name_03.str._M_len = (size_t)IVar63.str._M_str;
      IVar59.str._M_str =
           cashew::ValueBuilder::makeLabel((ValueBuilder *)IVar63.str._M_len,name_03,RVar32);
      break;
    }
    pEVar49 = *(Expression **)(curr + 2);
    goto LAB_001417e4;
  case BreakId:
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = curr[2].type.id;
    if (emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
      IVar59.str._M_str = makeBreakOrContinue(wasm::Name_(this,(Name)curr[1]);
      break;
    }
    uVar7 = (curr->type).id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *(undefined8 *)(curr + 1);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)curr[1].type.id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(curr + 2);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&old.str._M_str;
    old.str._M_str._0_4_ = (int)*(undefined8 *)curr;
    old.str._M_str._4_4_ = (undefined4)((ulong)*(undefined8 *)curr >> 0x20);
    targetIndexes._M_t._M_impl._0_4_ = SUB84(uVar7,0);
    targetIndexes._M_t._M_impl._4_4_ = SUB84(uVar7 >> 0x20,0);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pEVar49 = (Expression *)local_b8;
    local_b8[0] = 2;
    emittedTargets._M_t._M_impl._0_8_ = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    goto LAB_001417e4;
  case SwitchId:
    nextResult_09.str._M_str = (char *)cashew::RSHIFT;
    nextResult_09.str._M_len = EXPRESSION_RESULT;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)curr;
    IVar59.str._M_str = IString_(this,(Expression *)curr[4].type.id,nextResult_09);
    IVar59.str._M_str = (Value *)makeJsCoercion(IVar59.str._M_str,JS_INT);
    IVar59.str._M_str = cashew::ValueBuilder::makeSwitch(IVar59.str._M_str);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&targetIndexes
    ;
    targetIndexes._M_t._M_impl._0_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (curr[1].type.id != 0) {
      lVar29 = 0;
      uVar56 = 0;
      do {
        pmVar27 = std::
                  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&old.str._M_str,(key_type *)(*(long *)(curr + 1) + lVar29));
        local_b8._0_4_ = (uint)uVar56;
        __position._M_current =
             (pmVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pmVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (pmVar27,__position,(uint *)local_b8);
        }
        else {
          *__position._M_current = (uint)uVar56;
          (pmVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar56 = uVar56 + 1;
        lVar29 = lVar29 + 0x10;
      } while (uVar56 < curr[1].type.id);
    }
    local_c0 = std::
               map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
               ::operator[]((map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
                             *)((long)this + 0x1a8),
                            (key_type *)
                            &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&emittedTargets;
    emittedTargets._M_t._M_impl._0_8_ = (ulong)(uint)emittedTargets._M_t._M_impl._4_4_ << 0x20;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pSVar38 = (local_c0->
              super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (local_c0->
             super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (pSVar38 == pSVar4) {
      bVar57 = false;
    }
    else {
      bVar57 = false;
      do {
        local_d8.super_IString.str._M_len = (pSVar38->target).super_IString.str._M_len;
        local_d8.super_IString.str._M_str = (pSVar38->target).super_IString.str._M_str;
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)local_b8,&local_d8);
        if (local_d8.super_IString.str._M_str == (char *)curr[3].type.id) {
          cashew::ValueBuilder::appendDefaultToSwitch(IVar59.str._M_str);
        }
        else {
          pmVar27 = std::
                    map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                  *)&old.str._M_str,&local_d8);
          puVar5 = (pmVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar39 = (pmVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start; puVar39 != puVar5;
              puVar39 = puVar39 + 1) {
            uVar25 = *puVar39;
            pvVar48 = (void *)0x18;
            RVar32.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
            (RVar32.inst)->type = Null;
            cashew::Value::free(RVar32.inst,pvVar48);
            (RVar32.inst)->type = Number;
            ((RVar32.inst)->field_1).num = (double)uVar25;
            cashew::ValueBuilder::appendCaseToSwitch(IVar59.str._M_str,RVar32);
          }
        }
        ppEVar52 = (pSVar38->code).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar6 = (pSVar38->code).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppEVar52 != ppEVar6) {
          do {
            pVVar26 = (Value *)*ppEVar52;
            nextResult_10.str._M_str = (char *)_finalize;
            nextResult_10.str._M_len = (size_t)NO_RESULT;
            RVar32.inst = pVVar26;
            RVar33 = IString_(this,(Expression *)pVVar26,nextResult_10);
            RVar32 = blockify(cashew::Ref_(RVar33.inst,RVar32);
            cashew::ValueBuilder::appendCodeToSwitch(IVar59.str._M_str,RVar32,false);
            ppEVar52 = ppEVar52 + 1;
          } while (ppEVar52 != ppEVar6);
          bVar57 = (pVVar26->field_1).str.str._M_len == 1;
        }
        pSVar38 = pSVar38 + 1;
      } while (pSVar38 != pSVar4);
    }
    bVar54 = false;
    p_Var35 = targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&targetIndexes) {
      do {
        cVar34 = std::
                 _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)local_b8,(key_type *)(p_Var35 + 1));
        if (cVar34._M_node == (_Base_ptr)&emittedTargets) {
          if ((!bVar54) &&
             ((local_c0->
              super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
              )._M_impl.super__Vector_impl_data._M_start !=
              (local_c0->
              super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
              )._M_impl.super__Vector_impl_data._M_finish && !bVar57)) {
            RVar33.inst = (Value *)0x0;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = extraout_RDX_00;
            RVar32 = cashew::ValueBuilder::makeBreak((ValueBuilder *)0x0,(IString)(auVar10 << 0x40))
            ;
            RVar32 = blockify(cashew::Ref_(RVar32.inst,RVar33);
            bVar54 = true;
            cashew::ValueBuilder::appendCodeToSwitch(IVar59.str._M_str,RVar32,false);
          }
          if (p_Var35[1]._M_parent !=
              *(_Base_ptr *)(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x38)
             ) {
            p_Var8 = p_Var35[1]._M_right;
            for (p_Var45 = p_Var35[1]._M_left; p_Var45 != p_Var8;
                p_Var45 = (_Base_ptr)&p_Var45->field_0x4) {
              _Var3 = p_Var45->_M_color;
              pvVar48 = (void *)0x18;
              RVar32.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
              (RVar32.inst)->type = Null;
              cashew::Value::free(RVar32.inst,pvVar48);
              (RVar32.inst)->type = Number;
              ((RVar32.inst)->field_1).num = (double)_Var3;
              cashew::ValueBuilder::appendCaseToSwitch(IVar59.str._M_str,RVar32);
            }
            RVar32.inst = *(Value **)(p_Var35 + 1);
            RVar33 = makeBreakOrContinue(wasm::Name_(this,(Name)*(string_view *)(p_Var35 + 1));
            RVar32 = blockify(cashew::Ref_(RVar33.inst,RVar32);
            cashew::ValueBuilder::appendCodeToSwitch(IVar59.str._M_str,RVar32,false);
          }
        }
        p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35);
      } while (p_Var35 != (_Rb_tree_node_base *)&targetIndexes);
    }
    sVar43 = emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    cVar34 = std::
             _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
             ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)local_b8,
                    (key_type *)
                    (emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x30));
    if (cVar34._M_node == (_Base_ptr)&emittedTargets) {
      if ((!bVar54) &&
         ((local_c0->
          super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (local_c0->
          super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
          )._M_impl.super__Vector_impl_data._M_finish && !bVar57)) {
        RVar33.inst = (Value *)0x0;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = extraout_RDX_01;
        RVar32 = cashew::ValueBuilder::makeBreak((ValueBuilder *)0x0,(IString)(auVar11 << 0x40));
        RVar32 = blockify(cashew::Ref_(RVar32.inst,RVar33);
        cashew::ValueBuilder::appendCodeToSwitch(IVar59.str._M_str,RVar32,false);
      }
      cashew::ValueBuilder::appendDefaultToSwitch(IVar59.str._M_str);
      RVar32.inst = *(Value **)&((IString *)(sVar43 + 0x30))->str;
      RVar33 = makeBreakOrContinue(wasm::Name_(this,(Name)((IString *)(sVar43 + 0x30))->str);
      RVar32 = blockify(cashew::Ref_(RVar33.inst,RVar32);
      cashew::ValueBuilder::appendCodeToSwitch(IVar59.str._M_str,RVar32,false);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_b8);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)&old.str._M_str);
    break;
  case CallId:
    if (curr[4]._id == BlockId) {
      ppcVar1 = &old.str._M_str;
      Fatal::Fatal((Fatal *)ppcVar1);
      Fatal::operator<<((Fatal *)ppcVar1,(char (*) [40])"tail calls not yet supported in wasm2js");
      goto LAB_00143084;
    }
    IVar59 = fromName(*this,(Name)curr[3],Top);
    target_01.str._M_str = (uintptr_t)IVar59.str._M_str;
    target_01.str._M_len = target_01.str._M_str;
    IVar59.str._M_str = cashew::ValueBuilder::makeCall((ValueBuilder *)IVar59.str._M_len,target_01);
    old.str._M_str._0_4_ = (int)IVar59.str._M_str;
    old.str._M_str._4_4_ = (undefined4)((ulong)IVar59.str._M_str >> 0x20);
    bVar57 = true;
    if ((*(int *)(*this + 100) != 0) && (*(char *)((long)this + 0x28) == '\0')) {
      target_01.str._M_str = *(uintptr_t *)(curr + 3);
      NVar64.super_IString.str._M_str = (char *)target_01.str._M_str;
      NVar64.super_IString.str._M_len = *(size_t *)((long)this + 0x20);
      lVar29 = ::wasm::Module::getFunction(NVar64);
      bVar57 = *(long *)(lVar29 + 0x20) != 0;
    }
    uVar7 = curr[1].type.id;
    if (uVar7 != 0) {
      uVar56 = 0;
      do {
        if (curr[1].type.id <= uVar56) goto LAB_00142e06;
        pEVar49 = *(Expression **)(*(long *)(curr + 1) + uVar56 * 8);
        nextResult_19.str._M_str = (char *)cashew::RSHIFT;
        nextResult_19.str._M_len = EXPRESSION_RESULT;
        TVar47.id = (uintptr_t)pEVar49;
        target_01.str._M_str = (uintptr_t)IString_(this,pEVar49,nextResult_19);
        if (bVar57) {
          JVar24 = ::wasm::wasmToJsType((wasm *)(pEVar49->type).id,TVar47);
          target_01.str._M_str = makeJsCoercion((Ref)target_01.str._M_str,JVar24);
        }
        puVar44 = (undefined8 *)cashew::Ref::operator[]((int)&old + 8);
        cashew::Value::push_back((Value *)*puVar44,(Ref)target_01.str._M_str);
        uVar56 = uVar56 + 1;
      } while (uVar7 != uVar56);
    }
    if (bVar57) {
      RVar32.inst._4_4_ = old.str._M_str._4_4_;
      RVar32.inst._0_4_ = (int)old.str._M_str;
      JVar24 = ::wasm::wasmToJsType((wasm *)(curr->type).id,target_01.str._M_str);
      uVar30 = makeJsCoercion(RVar32,JVar24);
      old.str._M_str._0_4_ = (int)uVar30;
      old.str._M_str._4_4_ = (undefined4)((ulong)uVar30 >> 0x20);
    }
    IVar59.str._M_str = (Value *)CONCAT44(old.str._M_str._4_4_,(int)old.str._M_str);
    break;
  case CallIndirectId:
    IVar59.str._M_str = visitCallIndirect(wasm::CallIndirect__(this,(CallIndirect *)curr);
    break;
  case LocalGetId:
    sVar58 = (string_view)
             ::wasm::Function::getLocalNameOrGeneric((uint)*(undefined8 *)((long)this + 0x18));
    this_02 = *this;
    scope = Local;
    goto LAB_00141329;
  case LocalSetId:
    pEVar49 = (Expression *)curr[1].type.id;
    EVar60 = (Expression)
             ::wasm::Function::getLocalNameOrGeneric((uint)*(undefined8 *)((long)this + 0x18));
    IVar63.str._M_str = (char *)0x2;
    goto LAB_001417b8;
  case GlobalGetId:
  case RefFuncId:
    sVar58 = *(string_view *)(curr + 1);
    this_02 = *this;
    scope = Top;
LAB_00141329:
    sVar58 = (string_view)fromName(this_02,(Name)sVar58,scope);
    pvVar48 = (void *)0x18;
    IVar59.str._M_str = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (IVar59.str._M_str)->type = Null;
    cashew::Value::free(IVar59.str._M_str,pvVar48);
    (IVar59.str._M_str)->type = String;
    ((IVar59.str._M_str)->field_1).str.str = sVar58;
    break;
  case GlobalSetId:
    pEVar49 = *(Expression **)(curr + 2);
    EVar60 = curr[1];
    IVar63.str._M_str = (char *)0x1;
LAB_001417b8:
    name_04.super_IString.str._M_len = EVar60.type.id;
    name_04.super_IString.str._M_str = IVar63.str._M_str;
    IVar59.str._M_str =
         makeSetVar(wasm::Expression*,wasm::Expression*,wasm::Name,wasm::NameScope_
                   (this,pEVar49,EVar60._0_8_,name_04,(NameScope)in_R9.inst);
    break;
  case LoadId:
    if ((*(Value **)(curr + 2) != (Value *)0x0) &&
       (IVar59.str._M_str = (Value *)(ulong)curr[1]._id, *(Value **)(curr + 2) != IVar59.str._M_str)
       ) {
      __assert_fail("curr->align == 0 || curr->align == curr->bytes",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                    ,0x593,
                    "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitLoad(Load *)"
                   );
    }
    RVar32 = makePointer(wasm::Expression*,wasm::Address_
                       (this,*(Expression **)(curr + 3),(Address)curr[1].type.id);
    IVar63.str._M_str = _VTT;
    sVar43 = cashew::HEAPF64;
    local_b8 = (undefined1  [8])0x0;
    uVar56 = (curr->type).id;
    if (6 < uVar56) {
LAB_00142e25:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    iVar22 = (int)uVar56;
    if (iVar22 == 5) {
      pvVar48 = (void *)0x18;
      RVar33.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar33.inst)->type = Null;
      cashew::Value::free(RVar33.inst,pvVar48);
      (RVar33.inst)->type = String;
      ((RVar33.inst)->field_1).str.str._M_len = sVar43;
      ((RVar33.inst)->field_1).str.str._M_str = IVar63.str._M_str;
      iVar22 = 3;
    }
    else {
      if (iVar22 == 4) {
        psVar28 = &cashew::HEAPF32;
      }
      else {
        if (iVar22 != 2) {
          Fatal::Fatal((Fatal *)&old.str._M_str);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                     "Unhandled type in load: ",0x18);
          Fatal::operator<<((Fatal *)&old.str._M_str,&curr->type);
          goto LAB_00143084;
        }
        IVar2 = curr[1]._id;
        if (IVar2 != BreakId) {
          old.str._M_str._4_4_ = (undefined4)(uVar56 >> 0x20);
          old.str._M_str._0_4_ = iVar22;
          if (IVar2 == IfId) {
            if (((uVar56 < 6) &&
                (IVar59.str._M_str = (Value *)0x32, (0x32UL >> (uVar56 & 0x3f) & 1) != 0)) ||
               ((uVar25 = ::wasm::Type::getByteSize(), uVar25 <= IVar2 ||
                (curr[1].field_0x1 == '\0')))) {
              psVar28 = &cashew::HEAPU16;
            }
            else {
              psVar28 = (size_t *)&cashew::HEAP16;
            }
            sVar43 = *psVar28;
            IVar63.str._M_str = (char *)psVar28[1];
            pvVar48 = (void *)0x18;
            RVar33.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
            (RVar33.inst)->type = Null;
            cashew::Value::free(RVar33.inst,pvVar48);
            (RVar33.inst)->type = String;
            ((RVar33.inst)->field_1).str.str._M_len = sVar43;
            ((RVar33.inst)->field_1).str.str._M_str = IVar63.str._M_str;
            iVar22 = 1;
          }
          else {
            if (IVar2 != 1) {
              Fatal::Fatal((Fatal *)&old.str._M_str);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                         "Unhandled number of bytes in i32 load: ",0x27);
              Fatal::operator<<((Fatal *)&old.str._M_str,&curr[1]._id);
              goto LAB_00143084;
            }
            if ((((uVar56 < 6) &&
                 (IVar59.str._M_str = (Value *)0x32, (0x32UL >> (uVar56 & 0x3f) & 1) != 0)) ||
                (uVar25 = ::wasm::Type::getByteSize(), uVar25 < 2)) || (curr[1].field_0x1 == '\0'))
            {
              psVar28 = &cashew::HEAPU8;
            }
            else {
              psVar28 = &cashew::HEAP8;
            }
            sVar43 = *psVar28;
            IVar63.str._M_str = (char *)psVar28[1];
            pvVar48 = (void *)0x18;
            RVar33.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
            (RVar33.inst)->type = Null;
            cashew::Value::free(RVar33.inst,pvVar48);
            (RVar33.inst)->type = String;
            ((RVar33.inst)->field_1).str.str._M_len = sVar43;
            ((RVar33.inst)->field_1).str.str._M_str = IVar63.str._M_str;
            iVar22 = 0;
          }
          goto LAB_001423eb;
        }
        psVar28 = &cashew::HEAP32;
      }
      sVar43 = *psVar28;
      IVar63.str._M_str = (char *)psVar28[1];
      pvVar48 = (void *)0x18;
      RVar33.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar33.inst)->type = Null;
      cashew::Value::free(RVar33.inst,pvVar48);
      (RVar33.inst)->type = String;
      ((RVar33.inst)->field_1).str.str._M_len = sVar43;
      ((RVar33.inst)->field_1).str.str._M_str = IVar63.str._M_str;
      iVar22 = 2;
    }
LAB_001423eb:
    target_01.str._M_str = (uintptr_t)cashew::ValueBuilder::makePtrShift(RVar32,iVar22);
    local_b8 = (undefined1  [8])cashew::ValueBuilder::makeSub(RVar33,(Ref)target_01.str._M_str);
    IVar63.str._M_str = _makeJsCoercedZero;
    sVar43 = cashew::ATOMICS;
    if ((char)curr[2].type.id == '\x01') {
      pvVar48 = (void *)0x18;
      pVVar26 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar26->type = Null;
      cashew::Value::free(pVVar26,pvVar48);
      pVVar26->type = String;
      (pVVar26->field_1).str.str._M_len = sVar43;
      (pVVar26->field_1).str.str._M_str = IVar63.str._M_str;
      key_02.str._M_str = (char *)IVar59.str._M_str;
      key_02.str._M_len = std::cerr;
      IVar59.str._M_str = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar26,cashew::LOAD,key_02)
      ;
      IVar59.str._M_str = cashew::ValueBuilder::makeCall(IVar59.str._M_str);
      puVar44 = (undefined8 *)cashew::Ref::operator[]((uint)(Ref *)local_b8);
      cashew::ValueBuilder::appendToCall(IVar59.str._M_str,(Value *)*puVar44);
      puVar44 = (undefined8 *)cashew::Ref::operator[]((uint)(Ref *)local_b8);
      target_01.str._M_str = *puVar44;
      cashew::ValueBuilder::appendToCall(IVar59.str._M_str,(Ref)target_01.str._M_str);
      local_b8 = (undefined1  [8])IVar59.str._M_str;
    }
    auVar21 = local_b8;
    if ((*(int *)(*this + 100) == 0) ||
       (IVar59.str._M_str = (Value *)local_b8, (*(byte *)((long)this + 0x28) & 1) != 0)) {
      JVar24 = ::wasm::wasmToJsType((wasm *)(curr->type).id,target_01.str._M_str);
      IVar59.str._M_str = (Value *)makeJsCoercion((Ref)auVar21,JVar24);
    }
    break;
  case StoreId:
    IVar59.str._M_str = visitStore(wasm::Store__(this,(Store *)curr);
    break;
  case ConstId:
    IVar59.str._M_str =
         visitConst(wasm::Const__(curr,(Const *)&switchD_00140ac2::switchdataD_0017c0a8);
    break;
  case UnaryId:
    uVar56 = (curr->type).id;
    if (6 < uVar56) goto LAB_00142e25;
    iVar22 = (int)uVar56;
    if (1 < iVar22 - 4U) {
      if (iVar22 != 2) {
        Fatal::Fatal((Fatal *)&old.str._M_str);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                   "Unhandled type in unary: ",0x19);
        Fatal::operator<<((Fatal *)&old.str._M_str,(Unary *)curr);
        goto LAB_00143084;
      }
      iVar22 = *(int *)(curr + 1);
      if (iVar22 < 0x14) {
        if (iVar22 != 0) {
          if ((iVar22 == 2) || (iVar22 == 4)) {
            ::wasm::handle_unreachable
                      ("i32 unary should have been removed",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                       ,0x65c);
          }
          goto switchD_001421f3_caseD_31;
        }
        nextResult_33.str._M_str = (char *)cashew::RSHIFT;
        nextResult_33.str._M_len = EXPRESSION_RESULT;
        IVar59.str._M_str = cashew::RSHIFT;
        RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_33);
        goto LAB_00141fb5;
      }
      IVar59.str._M_str = cashew::RSHIFT;
      if (iVar22 - 0x14U < 0xe) {
        IVar63.str._M_str =
             (char *)((long)&switchD_00142509::switchdataD_0017c444 +
                     (long)(int)(&switchD_00142509::switchdataD_0017c444)[iVar22 - 0x14U]);
        switch(iVar22) {
        case 0x14:
          nextResult_47.str._M_str = (char *)cashew::RSHIFT;
          nextResult_47.str._M_len = EXPRESSION_RESULT;
          RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_47);
          break;
        default:
          goto switchD_001421f3_caseD_31;
        case 0x19:
        case 0x1d:
          goto switchD_001421f3_caseD_34;
        case 0x1b:
        case 0x1f:
          goto switchD_001421f3_caseD_35;
        case 0x21:
          IVar63.str._M_len = std::cout;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_F32,IVar63);
          specific_08.str._M_str = IVar63.str._M_str;
          specific_08.str._M_len = _containsPass;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_LOAD_I32,specific_08);
          sVar43 = std::cout;
          pMVar50 = ABI::wasm2js::SCRATCH_STORE_F32;
          nextResult_46.str._M_str = (char *)cashew::RSHIFT;
          nextResult_46.str._M_len = EXPRESSION_RESULT;
          IVar59.str._M_str = cashew::RSHIFT;
          RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_46);
          target_10.str._M_str = (char *)RVar32.inst;
          target_10.str._M_len = sVar43;
          RVar32 = cashew::ValueBuilder::makeCall<cashew::Ref>
                             ((ValueBuilder *)pMVar50,target_10,IVar59.str._M_str);
          sVar43 = _containsPass;
          pMVar50 = ABI::wasm2js::SCRATCH_LOAD_I32;
          pvVar48 = (void *)0x18;
          pVVar26 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
          pVVar26->type = Null;
          cashew::Value::free(pVVar26,pvVar48);
          pVVar26->type = Number;
          (pVVar26->field_1).str.str._M_len = 0x4000000000000000;
          target_11.str._M_str = (char *)pVVar26;
          target_11.str._M_len = sVar43;
          IVar59.str._M_str =
               cashew::ValueBuilder::makeCall<cashew::Ref>
                         ((ValueBuilder *)pMVar50,target_11,IVar59.str._M_str);
          goto LAB_00142a1b;
        }
LAB_00142a50:
        op_10.str._M_str = (char *)RVar32.inst;
        op_10.str._M_len = sVar53;
        IVar59.str._M_str = cashew::ValueBuilder::makeUnary(this_03,op_10,IVar59.str._M_str);
        break;
      }
      switch(iVar22) {
      case 0x2f:
        nextResult_35.str._M_str = (char *)cashew::RSHIFT;
        nextResult_35.str._M_len = EXPRESSION_RESULT;
        RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_35);
        sVar43 = ___cxa_begin_catch;
        IVar59.str._M_str = cashew::LSHIFT.inst;
        pvVar48 = (void *)0x18;
        pVVar26 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar26->type = Null;
        cashew::Value::free(pVVar26,pvVar48);
        pVVar26->type = Number;
        (pVVar26->field_1).arr = (ArrayStorage *)0x4038000000000000;
        op_00.str._M_str = (char *)pVVar26;
        op_00.str._M_len = sVar43;
        IVar59.str._M_str =
             cashew::ValueBuilder::makeBinary(RVar32.inst,IVar59.str._M_str,op_00,in_R8);
        uVar30 = _operator_delete;
        pVVar26 = cashew::RSHIFT;
        pvVar48 = (void *)0x18;
        RVar32.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar32.inst)->type = Null;
        cashew::Value::free(RVar32.inst,pvVar48);
        (RVar32.inst)->type = Number;
        pAVar37 = (ArrayStorage *)0x4038000000000000;
        break;
      case 0x30:
        nextResult_48.str._M_str = (char *)cashew::RSHIFT;
        nextResult_48.str._M_len = EXPRESSION_RESULT;
        RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_48);
        sVar43 = ___cxa_begin_catch;
        IVar59.str._M_str = cashew::LSHIFT.inst;
        pvVar48 = (void *)0x18;
        pVVar26 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar26->type = Null;
        cashew::Value::free(pVVar26,pvVar48);
        pVVar26->type = Number;
        (pVVar26->field_1).arr = (ArrayStorage *)0x4030000000000000;
        op_04.str._M_str = (char *)pVVar26;
        op_04.str._M_len = sVar43;
        IVar59.str._M_str =
             cashew::ValueBuilder::makeBinary(RVar32.inst,IVar59.str._M_str,op_04,in_R8);
        uVar30 = _operator_delete;
        pVVar26 = cashew::RSHIFT;
        pvVar48 = (void *)0x18;
        RVar32.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar32.inst)->type = Null;
        cashew::Value::free(RVar32.inst,pvVar48);
        (RVar32.inst)->type = Number;
        pAVar37 = (ArrayStorage *)0x4030000000000000;
        break;
      default:
switchD_001421f3_caseD_31:
        ::wasm::handle_unreachable
                  ("unhandled unary",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                   ,0x69c);
      case 0x34:
      case 0x36:
switchD_001421f3_caseD_34:
        nextResult_36.str._M_str = (char *)cashew::RSHIFT;
        nextResult_36.str._M_len = EXPRESSION_RESULT;
        RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_36);
        op_07.str._M_str = (char *)RVar32.inst;
        op_07.str._M_len = sVar16;
        RVar32 = cashew::ValueBuilder::makeUnary(this_00,op_07,IVar59.str._M_str);
        sVar53 = sVar16;
        this_03 = this_00;
        goto LAB_00142a50;
      case 0x35:
      case 0x37:
switchD_001421f3_caseD_35:
        nextResult_38.str._M_str = (char *)cashew::RSHIFT;
        nextResult_38.str._M_len = EXPRESSION_RESULT;
        RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_38);
        op_08.str._M_str = (char *)RVar32.inst;
        op_08.str._M_len = sVar16;
        RVar32 = cashew::ValueBuilder::makeUnary(this_00,op_08,IVar59.str._M_str);
        op_09.str._M_str = (char *)RVar32.inst;
        op_09.str._M_len = sVar16;
        IVar59.str._M_str = cashew::ValueBuilder::makeUnary(this_00,op_09,IVar59.str._M_str);
        auVar61._8_8_ = CEIL;
        auVar61._0_8_ = cashew::TRSHIFT.inst;
        pvVar48 = (void *)0x18;
        RVar32.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar32.inst)->type = Null;
        cashew::Value::free(RVar32.inst,pvVar48);
        (RVar32.inst)->type = Number;
        ((RVar32.inst)->field_1).str.str._M_len = 0;
        goto LAB_00141b7f;
      }
      auVar61._8_8_ = uVar30;
      auVar61._0_8_ = pVVar26;
      ((RVar32.inst)->field_1).arr = pAVar37;
      goto LAB_00141b7f;
    }
    switch(*(undefined4 *)(curr + 1)) {
    case 6:
    case 7:
      nextResult_13.str._M_str = (char *)cashew::RSHIFT;
      nextResult_13.str._M_len = EXPRESSION_RESULT;
      IVar59.str._M_str = cashew::RSHIFT;
      RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_13);
      op_06.str._M_str = (char *)RVar32.inst;
      op_06.str._M_len = sVar12;
      IVar59.str._M_str = cashew::ValueBuilder::makeUnary(pVVar9,op_06,IVar59.str._M_str);
      goto LAB_001425a0;
    case 8:
    case 9:
      puVar44 = &MATH_ABS;
      break;
    case 10:
    case 0xb:
      puVar44 = &MATH_CEIL;
      break;
    case 0xc:
    case 0xd:
      puVar44 = &MATH_FLOOR;
      break;
    case 0xe:
    case 0xf:
      puVar44 = &MATH_TRUNC;
      break;
    case 0x10:
    case 0x11:
      ::wasm::handle_unreachable
                ("operation should have been removed in previous passes",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x6f2);
    case 0x12:
    case 0x13:
      puVar44 = &MATH_SQRT;
      break;
    default:
      ::wasm::handle_unreachable
                ("unhandled unary float operator",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x6f5);
    case 0x23:
      nextResult_45.str._M_str = (char *)cashew::RSHIFT;
      nextResult_45.str._M_len = EXPRESSION_RESULT;
      IVar59.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_45);
      IVar59.str._M_str = (Value *)makeJsCoercion(IVar59.str._M_str,JS_INT);
      goto LAB_001425ad;
    case 0x24:
      nextResult_43.str._M_str = (char *)cashew::RSHIFT;
      nextResult_43.str._M_len = EXPRESSION_RESULT;
      IVar59.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_43);
      IVar59.str._M_str = (Value *)makeJsCoercion(IVar59.str._M_str,JS_INT);
      goto LAB_00142872;
    case 0x25:
      nextResult_40.str._M_str = (char *)cashew::RSHIFT;
      nextResult_40.str._M_len = EXPRESSION_RESULT;
      RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_40);
      sVar43 = CEIL;
      IVar59.str._M_str = cashew::TRSHIFT.inst;
      pvVar48 = (void *)0x18;
      pVVar26 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar26->type = Null;
      cashew::Value::free(pVVar26,pvVar48);
      pVVar26->type = Number;
      (pVVar26->field_1).str.str._M_len = 0;
      op_02.str._M_str = (char *)pVVar26;
      op_02.str._M_len = sVar43;
      IVar59.str._M_str =
           cashew::ValueBuilder::makeBinary(RVar32.inst,IVar59.str._M_str,op_02,in_R8);
      goto LAB_001425ad;
    case 0x26:
      nextResult_42.str._M_str = (char *)cashew::RSHIFT;
      nextResult_42.str._M_len = EXPRESSION_RESULT;
      RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_42);
      sVar43 = CEIL;
      IVar59.str._M_str = cashew::TRSHIFT.inst;
      pvVar48 = (void *)0x18;
      pVVar26 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar26->type = Null;
      cashew::Value::free(pVVar26,pvVar48);
      pVVar26->type = Number;
      (pVVar26->field_1).str.str._M_len = 0;
      op_03.str._M_str = (char *)pVVar26;
      op_03.str._M_len = sVar43;
      IVar59.str._M_str =
           cashew::ValueBuilder::makeBinary(RVar32.inst,IVar59.str._M_str,op_03,in_R8);
      goto LAB_00142872;
    case 0x2b:
      nextResult_39.str._M_str = (char *)cashew::RSHIFT;
      nextResult_39.str._M_len = EXPRESSION_RESULT;
      IVar59.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_39);
LAB_00142872:
      JVar24 = JS_DOUBLE;
      goto LAB_001425b2;
    case 0x2c:
      nextResult_44.str._M_str = (char *)cashew::RSHIFT;
      nextResult_44.str._M_len = EXPRESSION_RESULT;
      IVar59.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_44);
      goto LAB_001425ad;
    case 0x2d:
      specific_06.str._M_str = (char *)&switchD_001412d4::switchdataD_0017c3a4;
      specific_06.str._M_len = ABI::wasm2js::SCRATCH_LOAD_F64;
      puVar39 = &switchD_001412d4::switchdataD_0017c3a4;
      ABI::wasm2js::ensureHelpers
                (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_I32,specific_06);
      specific_07.str._M_str = (char *)puVar39;
      specific_07.str._M_len = __Unwind_Resume;
      ABI::wasm2js::ensureHelpers
                (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_LOAD_F32,specific_07);
      sVar43 = ABI::wasm2js::SCRATCH_LOAD_F64;
      pMVar50 = ABI::wasm2js::SCRATCH_STORE_I32;
      pvVar48 = (void *)0x18;
      pVVar26 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar26->type = Null;
      cashew::Value::free(pVVar26,pvVar48);
      pVVar26->type = Number;
      (pVVar26->field_1).str.str._M_len = 0x4000000000000000;
      nextResult_41.str._M_str = (char *)cashew::RSHIFT;
      nextResult_41.str._M_len = EXPRESSION_RESULT;
      IVar59.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_41);
      target_08.str._M_str = (char *)pVVar26;
      target_08.str._M_len = sVar43;
      RVar32 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                         ((ValueBuilder *)pMVar50,target_08,IVar59.str._M_str,in_R8);
      target_09.str._M_str = extraout_RDX_02;
      target_09.str._M_len = __Unwind_Resume;
      IVar59.str._M_str =
           cashew::ValueBuilder::makeCall((ValueBuilder *)ABI::wasm2js::SCRATCH_LOAD_F32,target_09);
LAB_00142a1b:
      IVar59.str._M_str = cashew::ValueBuilder::makeSeq(RVar32,IVar59.str._M_str);
      goto LAB_001425ba;
    }
    pVVar9 = (ValueBuilder *)*puVar44;
    sVar43 = puVar44[1];
    nextResult_37.str._M_str = (char *)cashew::RSHIFT;
    nextResult_37.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = cashew::RSHIFT;
    RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_37);
    target_07.str._M_str = (char *)RVar32.inst;
    target_07.str._M_len = sVar43;
    IVar59.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar9,target_07,IVar59.str._M_str);
LAB_001425a0:
    if ((curr->type).id != 4) break;
LAB_001425ad:
    JVar24 = JS_FLOAT;
    goto LAB_001425b2;
  case BinaryId:
    nextResult_07.str._M_str = (char *)cashew::RSHIFT;
    nextResult_07.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_07);
    nextResult_08.str._M_str = (char *)cashew::RSHIFT;
    nextResult_08.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,*(Expression **)(curr + 2),nextResult_08);
    uVar56 = (curr->type).id;
    if (6 < uVar56) goto LAB_00142e25;
    if ((int)uVar56 - 4U < 2) {
      switch(*(undefined4 *)(curr + 1)) {
      case 0x32:
      case 0x3f:
        puVar44 = &cashew::PLUS;
        break;
      case 0x33:
      case 0x40:
        puVar44 = &cashew::MINUS;
        break;
      case 0x34:
      case 0x41:
        puVar44 = &cashew::MUL;
        break;
      case 0x35:
      case 0x42:
        puVar44 = &cashew::DIV;
        break;
      default:
        ppcVar1 = &old.str._M_str;
        Fatal::Fatal((Fatal *)ppcVar1);
        Fatal::operator<<((Fatal *)ppcVar1,(char (*) [34])"Unhandled binary float operator: ");
        goto LAB_00143084;
      case 0x37:
      case 0x44:
        puVar44 = &MATH_MIN;
        goto LAB_00142312;
      case 0x38:
      case 0x45:
        puVar44 = &MATH_MAX;
LAB_00142312:
        target_06.str._M_str = (char *)IVar59.str._M_str;
        target_06.str._M_len = puVar44[1];
        IVar59.str._M_str =
             cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                       ((ValueBuilder *)*puVar44,target_06,RVar32,in_R8);
        goto LAB_001425a0;
      }
      op_01.str._M_str = (char *)RVar32.inst;
      op_01.str._M_len = puVar44[1];
      IVar59.str._M_str =
           cashew::ValueBuilder::makeBinary(IVar59.str._M_str,(Value *)*puVar44,op_01,in_R8);
      goto LAB_001425a0;
    }
    if ((int)uVar56 != 2) {
      Fatal::Fatal((Fatal *)&old.str._M_str);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                 "Unhandled type in binary: ",0x1a);
      Fatal::operator<<((Fatal *)&old.str._M_str,(Binary *)curr);
LAB_00143084:
      Fatal::~Fatal((Fatal *)&old.str._M_str);
    }
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
      puVar44 = &cashew::PLUS;
      break;
    case 1:
      puVar44 = &cashew::MINUS;
      break;
    case 2:
      sVar43 = cashew::CONDITIONAL;
      pMVar50 = MATH_IMUL;
      if (uVar56 == 2) goto LAB_00140b57;
      pauVar36 = (undefined1 (*) [16])&cashew::MUL;
      goto LAB_00142dcd;
    case 3:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_SIGNED);
      puVar44 = &cashew::DIV;
      goto LAB_00142cf3;
    case 4:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_UNSIGNED);
      puVar44 = &cashew::DIV;
      goto LAB_00142c96;
    case 5:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_SIGNED);
      puVar44 = &cashew::MOD;
LAB_00142cf3:
      target_01.str._M_str = *puVar44;
      sVar43 = puVar44[1];
      JVar46 = JS_SIGNED;
LAB_00142d02:
      RVar32.inst = (Value *)makeSigning(RVar32,JVar46);
      goto LAB_00142d2d;
    case 6:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_UNSIGNED);
      puVar44 = &cashew::MOD;
LAB_00142c96:
      target_01.str._M_str = *puVar44;
      sVar43 = puVar44[1];
      JVar46 = JS_UNSIGNED;
      goto LAB_00142d02;
    case 7:
      puVar44 = &cashew::AND;
      break;
    case 8:
      puVar44 = &cashew::OR;
      break;
    case 9:
      puVar44 = &cashew::XOR;
      break;
    case 10:
      puVar44 = &cashew::LSHIFT.inst;
      break;
    case 0xb:
      puVar44 = &cashew::RSHIFT;
      break;
    case 0xc:
      puVar44 = &cashew::TRSHIFT.inst;
      break;
    case 0xd:
    case 0xe:
      ::wasm::handle_unreachable
                ("should be removed already",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x77c);
    case 0xf:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_SIGNED);
      puVar44 = &cashew::EQ;
      goto LAB_00142da7;
    case 0x10:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_SIGNED);
      puVar44 = &cashew::NE;
      goto LAB_00142da7;
    case 0x11:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_SIGNED);
      puVar44 = &cashew::LT;
      goto LAB_00142da7;
    case 0x12:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_UNSIGNED);
      puVar44 = &cashew::LT;
      goto LAB_00142d7c;
    case 0x13:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_SIGNED);
      puVar44 = &cashew::LE;
      goto LAB_00142da7;
    case 0x14:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_UNSIGNED);
      puVar44 = &cashew::LE;
      goto LAB_00142d7c;
    case 0x15:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_SIGNED);
      puVar44 = &cashew::GT;
      goto LAB_00142da7;
    case 0x16:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_UNSIGNED);
      puVar44 = &cashew::GT;
      goto LAB_00142d7c;
    case 0x17:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_SIGNED);
      puVar44 = &cashew::GE;
LAB_00142da7:
      uVar30 = *puVar44;
      uVar55 = puVar44[1];
      JVar46 = JS_SIGNED;
LAB_00142db6:
      auVar61._8_8_ = uVar55;
      auVar61._0_8_ = uVar30;
      RVar32.inst = (Value *)makeSigning(RVar32,JVar46);
      goto LAB_00141b7f;
    case 0x18:
      IVar59.str._M_str = (Value *)makeSigning(IVar59.str._M_str,JS_UNSIGNED);
      puVar44 = &cashew::GE;
LAB_00142d7c:
      uVar30 = *puVar44;
      uVar55 = puVar44[1];
      JVar46 = JS_UNSIGNED;
      goto LAB_00142db6;
    default:
      ::wasm::handle_unreachable
                ("unhandled i32 binary operator",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x77e);
    case 0x39:
    case 0x46:
      pauVar36 = (undefined1 (*) [16])&cashew::EQ;
      goto LAB_00142dcd;
    case 0x3a:
    case 0x47:
      pauVar36 = (undefined1 (*) [16])&cashew::NE;
      goto LAB_00142dcd;
    case 0x3b:
    case 0x48:
      pauVar36 = (undefined1 (*) [16])&cashew::LT;
      goto LAB_00142dcd;
    case 0x3c:
    case 0x49:
      pauVar36 = (undefined1 (*) [16])&cashew::LE;
      goto LAB_00142dcd;
    case 0x3d:
    case 0x4a:
      pauVar36 = (undefined1 (*) [16])&cashew::GT;
      goto LAB_00142dcd;
    case 0x3e:
    case 0x4b:
      pauVar36 = (undefined1 (*) [16])&cashew::GE;
LAB_00142dcd:
      auVar61 = *pauVar36;
LAB_00141b7f:
      op.str._M_len = auVar61._8_8_;
      op.str._M_str = (char *)RVar32.inst;
      IVar59.str._M_str = cashew::ValueBuilder::makeBinary(IVar59.str._M_str,auVar61._0_8_,op,in_R8)
      ;
      goto LAB_001425ba;
    }
    target_01.str._M_str = *puVar44;
    sVar43 = puVar44[1];
LAB_00142d2d:
    op_05.str._M_str = (char *)RVar32.inst;
    op_05.str._M_len = sVar43;
    IVar59.str._M_str =
         cashew::ValueBuilder::makeBinary(IVar59.str._M_str,(Ref)target_01.str._M_str,op_05,in_R8);
    JVar24 = ::wasm::wasmToJsType((wasm *)(curr->type).id,target_01.str._M_str);
LAB_001425b2:
    IVar59.str._M_str = (Value *)makeJsCoercion(IVar59.str._M_str,JVar24);
    break;
  case SelectId:
    IVar59.str._M_str = visitSelect(wasm::Select__(this,(Select *)curr);
    break;
  case DropId:
    pEVar49 = *(Expression **)(curr + 1);
    IVar59.str._M_str = _finalize;
    pcVar41 = NO_RESULT;
LAB_001417e4:
    nextResult_21.str._M_str = (char *)IVar59.str._M_str;
    nextResult_21.str._M_len = (size_t)pcVar41;
    IVar59.str._M_str = IString_(this,pEVar49,nextResult_21);
    break;
  case ReturnId:
    target_01.str._M_str = *(uintptr_t *)(curr + 1);
    if ((Expression *)target_01.str._M_str == (Expression *)0x0) {
      IVar59.str._M_str = (Value *)0x0;
    }
    else {
      nextResult_22.str._M_str = (char *)cashew::RSHIFT;
      nextResult_22.str._M_len = EXPRESSION_RESULT;
      IVar59.str._M_str = IString_(this,(Expression *)target_01.str._M_str,nextResult_22);
      if ((*(int *)(*this + 100) != 0) && (*(char *)((long)this + 0x28) == '\0')) {
        target_01.str._M_str = *(undefined8 *)((long)this + 0x18);
        sVar31 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)(*this + 0x380),(key_type *)target_01.str._M_str);
        if (sVar31 == 0) goto LAB_00141d3d;
      }
      JVar24 = ::wasm::wasmToJsType(*(wasm **)(*(long *)(curr + 1) + 8),target_01.str._M_str);
      IVar59.str._M_str = (Value *)makeJsCoercion(IVar59.str._M_str,JVar24);
    }
LAB_00141d3d:
    IVar59.str._M_str = cashew::ValueBuilder::makeReturn(IVar59.str._M_str);
    break;
  case MemorySizeId:
    sVar43 = FUNCTION_TABLE;
    pMVar50 = WASM_MEMORY_SIZE;
    goto LAB_0014178b;
  case MemoryGrowId:
    pwVar51 = *(wasm2js **)((long)this + 0x20);
    if ((*(long **)(pwVar51 + 0x78) == *(long **)(pwVar51 + 0x80)) ||
       (lVar29 = **(long **)(pwVar51 + 0x78), IVar59.str._M_str = *(Value **)(lVar29 + 0x40),
       IVar59.str._M_str <= *(Value **)(lVar29 + 0x38))) goto LAB_00141771;
    target_01.str._M_str = *(uintptr_t *)(curr + 1);
    nextResult_20.str._M_str = (char *)cashew::RSHIFT;
    nextResult_20.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = IString_(this,(Expression *)target_01.str._M_str,nextResult_20);
    JVar24 = ::wasm::wasmToJsType(*(wasm **)(*(long *)(curr + 1) + 8),target_01.str._M_str);
    RVar32.inst = (Value *)makeJsCoercion(IVar59.str._M_str,JVar24);
    IVar59.str._M_str = (Value *)curr;
    sVar43 = sVar20;
    pMVar50 = pMVar19;
    goto LAB_00141fb5;
  case NopId:
  case AtomicFenceId:
    IVar59.str._M_str = cashew::ValueBuilder::makeToplevel();
    break;
  case UnreachableId:
    pwVar51 = *(wasm2js **)((long)this + 0x20);
LAB_00141771:
    specific_03.str._M_str = (char *)IVar59.str._M_str;
    specific_03.str._M_len = __M_create;
    ABI::wasm2js::ensureHelpers(pwVar51,ABI::wasm2js::TRAP,specific_03);
    pcVar41 = extraout_RDX;
    sVar43 = __M_create;
    pMVar50 = ABI::wasm2js::TRAP;
LAB_0014178b:
    target_02.str._M_str = pcVar41;
    target_02.str._M_len = sVar43;
    IVar59.str._M_str = cashew::ValueBuilder::makeCall((ValueBuilder *)pMVar50,target_02);
    break;
  case AtomicRMWId:
    HVar62 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)(byte)curr[1].field_0x4,*(Expression **)(curr + 2),
                        (Index)curr[1].type.id);
    puVar39 = &switchD_001410ae::switchdataD_0017c4a0;
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
      IVar63.str._M_str = "add";
      break;
    case 1:
      IVar63.str._M_str = "sub";
      break;
    case 2:
      IVar63.str._M_str = "and";
      break;
    case 3:
      IVar63.str._M_str = "or";
      uVar30 = 2;
      goto LAB_00142109;
    case 4:
      IVar63.str._M_str = "xor";
      break;
    case 5:
      IVar63.str._M_str = "exchange";
      uVar30 = 8;
      goto LAB_00142109;
    default:
      ::wasm::handle_unreachable
                ("unimp",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x82f);
    }
    uVar30 = 3;
LAB_00142109:
    auVar61 = ::wasm::IString::interned(uVar30,IVar63.str._M_str,0);
    IVar63.str._M_str = _makeJsCoercedZero;
    sVar43 = cashew::ATOMICS;
    key_01.str._M_len = auVar61._8_8_;
    pvVar48 = (void *)0x18;
    pVVar26 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar26->type = Null;
    cashew::Value::free(pVVar26,pvVar48);
    pVVar26->type = String;
    (pVVar26->field_1).str.str._M_len = sVar43;
    (pVVar26->field_1).str.str._M_str = IVar63.str._M_str;
    key_01.str._M_str = (char *)puVar39;
    IVar59.str._M_str = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar26,auVar61._0_8_,key_01);
    IVar59.str._M_str = cashew::ValueBuilder::makeCall(IVar59.str._M_str);
    cashew::ValueBuilder::appendToCall(IVar59.str._M_str,HVar62.heap.inst);
    cashew::ValueBuilder::appendToCall(IVar59.str._M_str,HVar62.ptr.inst);
    nextResult_34.str._M_str = (char *)cashew::RSHIFT;
    nextResult_34.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,(Expression *)curr[2].type.id,nextResult_34);
LAB_001421ac:
    cashew::ValueBuilder::appendToCall(IVar59.str._M_str,RVar32);
    break;
  case AtomicCmpxchgId:
    HVar62 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)curr[1]._id,*(Expression **)(curr + 2),(Index)curr[1].type.id);
    nextResult_24.str._M_str = (char *)cashew::RSHIFT;
    nextResult_24.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,(Expression *)curr[2].type.id,nextResult_24);
    nextResult_25.str._M_str = (char *)cashew::RSHIFT;
    nextResult_25.str._M_len = EXPRESSION_RESULT;
    pVVar26 = cashew::RSHIFT;
    target_01.str._M_str = (uintptr_t)IString_(this,*(Expression **)(curr + 3),nextResult_25);
    IVar63.str._M_str = _makeJsCoercedZero;
    sVar43 = cashew::ATOMICS;
    pvVar48 = (void *)0x18;
    this_01 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    this_01->type = Null;
    cashew::Value::free(this_01,pvVar48);
    this_01->type = String;
    (this_01->field_1).str.str._M_len = sVar43;
    (this_01->field_1).str.str._M_str = IVar63.str._M_str;
    key.str._M_str = (char *)pVVar26;
    key.str._M_len = _isIdentPart;
    IVar59.str._M_str =
         cashew::ValueBuilder::makeDot((ValueBuilder *)this_01,cashew::COMPARE_EXCHANGE,key);
    IVar59.str._M_str = cashew::ValueBuilder::makeCall(IVar59.str._M_str);
    local_50 = HVar62.heap.inst;
    cashew::ValueBuilder::appendToCall(IVar59.str._M_str,local_50);
    local_48 = HVar62.ptr.inst;
    cashew::ValueBuilder::appendToCall(IVar59.str._M_str,local_48);
    cashew::ValueBuilder::appendToCall(IVar59.str._M_str,RVar32);
    cashew::ValueBuilder::appendToCall(IVar59.str._M_str,(Ref)target_01.str._M_str);
    JVar24 = ::wasm::wasmToJsType((wasm *)(curr->type).id,target_01.str._M_str);
    goto LAB_001425b2;
  case AtomicWaitId:
  case SIMDExtractId:
  case SIMDReplaceId:
  case SIMDShuffleId:
  case SIMDTernaryId:
  case SIMDShiftId:
  case SIMDLoadId:
  case SIMDLoadStoreLaneId:
  case PopId:
  case TableInitId:
  case TryId:
  case TryTableId:
  case ThrowId:
  case RethrowId:
  case ThrowRefId:
  case TupleMakeId:
  case TupleExtractId:
  case RefI31Id:
  case I31GetId:
  case CallRefId:
  case RefTestId:
  case RefCastId:
  case BrOnId:
  case StructNewId:
  case StructGetId:
  case StructSetId:
  case StructRMWId:
  case StructCmpxchgId:
  case ArrayNewId:
  case ArrayNewDataId:
  case ArrayNewElemId:
  case ArrayNewFixedId:
  case ArrayGetId:
  case ArraySetId:
  case ArrayLenId:
  case ArrayCopyId:
  case ArrayFillId:
  case ArrayInitDataId:
  case ArrayInitElemId:
  case StringNewId:
  case StringConstId:
  case StringMeasureId:
  case StringEncodeId:
  case StringConcatId:
  case StringEqId:
  case StringWTF16GetId:
  case StringSliceWTFId:
  case ContNewId:
  case ContBindId:
  case SuspendId:
  case ResumeId:
  case ResumeThrowId:
  case StackSwitchId:
    unimplemented(wasm::Expression__(curr,(Expression *)&switchD_00140ac2::switchdataD_0017c0a8);
    goto LAB_00142de7;
  case AtomicNotifyId:
    pvVar48 = (void *)0x18;
    pVVar26 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar26->type = Null;
    cashew::Value::free(pVVar26,pvVar48);
    pVVar26->type = String;
    local_48.inst._0_4_ = (undefined4)sVar17;
    local_48.inst._4_4_ = (undefined4)(sVar17 >> 0x20);
    uStack_40 = SUB84(pcVar18,0);
    uStack_3c = (undefined4)((ulong)pcVar18 >> 0x20);
    *(undefined4 *)&pVVar26->field_1 = local_48.inst._0_4_;
    *(undefined4 *)((long)&pVVar26->field_1 + 4) = local_48.inst._4_4_;
    *(undefined4 *)((long)&pVVar26->field_1 + 8) = uStack_40;
    *(undefined4 *)((long)&pVVar26->field_1 + 0xc) = uStack_3c;
    auVar61 = ::wasm::IString::interned(6,"notify",0);
    key_00.str._M_len = auVar61._8_8_;
    key_00.str._M_str = (char *)IVar59.str._M_str;
    IVar59.str._M_str = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar26,auVar61._0_8_,key_00);
    IVar59.str._M_str = cashew::ValueBuilder::makeCall(IVar59.str._M_str);
    IVar63.str._M_str = cashew::HEAP16;
    sVar43 = cashew::HEAP32;
    pvVar48 = (void *)0x18;
    RVar32.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar32.inst)->type = Null;
    cashew::Value::free(RVar32.inst,pvVar48);
    (RVar32.inst)->type = String;
    ((RVar32.inst)->field_1).str.str._M_len = sVar43;
    ((RVar32.inst)->field_1).str.str._M_str = IVar63.str._M_str;
    cashew::ValueBuilder::appendToCall(IVar59.str._M_str,RVar32);
    RVar32 = makePointer(wasm::Expression*,wasm::Address_
                       (this,(Expression *)curr[1].type.id,(Address)*(address64_t *)(curr + 1));
    RVar32 = cashew::ValueBuilder::makePtrShift(RVar32,2);
    cashew::ValueBuilder::appendToCall(IVar59.str._M_str,RVar32);
    nextResult_26.str._M_str = (char *)cashew::RSHIFT;
    nextResult_26.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,*(Expression **)(curr + 2),nextResult_26);
    RVar32.inst = (Value *)makeSigning(RVar32,JS_UNSIGNED);
    goto LAB_001421ac;
  case MemoryInitId:
    specific_00.str._M_str = (char *)IVar59.str._M_str;
    specific_00.str._M_len = _finalize;
    ABI::wasm2js::ensureHelpers
              (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::MEMORY_INIT,specific_00);
    sVar43 = _finalize;
    pMVar50 = ABI::wasm2js::MEMORY_INIT;
    IVar23 = getDataIndex(*this,(Name)curr[1]);
    pvVar48 = (void *)0x18;
    pVVar26 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar26->type = Null;
    cashew::Value::free(pVVar26,pvVar48);
    pVVar26->type = Number;
    (pVVar26->field_1).num = (double)IVar23;
    nextResult_04.str._M_str = (char *)cashew::RSHIFT;
    nextResult_04.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = IString_(this,*(Expression **)(curr + 2),nextResult_04);
    nextResult_05.str._M_str = (char *)cashew::RSHIFT;
    nextResult_05.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,(Expression *)curr[2].type.id,nextResult_05);
    nextResult_06.str._M_str = (char *)cashew::RSHIFT;
    nextResult_06.str._M_len = EXPRESSION_RESULT;
    RVar33 = IString_(this,*(Expression **)(curr + 3),nextResult_06);
    target_00.str._M_str = (char *)pVVar26;
    target_00.str._M_len = sVar43;
    IVar59.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref,cashew::Ref>
                   ((ValueBuilder *)pMVar50,target_00,IVar59.str._M_str,RVar32,RVar33,args_3);
    break;
  case DataDropId:
    specific_02.str._M_str = (char *)IVar59.str._M_str;
    specific_02.str._M_len = _dump;
    ABI::wasm2js::ensureHelpers
              (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::DATA_DROP,specific_02);
    sVar43 = _dump;
    pMVar50 = ABI::wasm2js::DATA_DROP;
    IVar23 = getDataIndex(*this,(Name)curr[1]);
    pvVar48 = (void *)0x18;
    RVar32.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar32.inst)->type = Null;
    cashew::Value::free(RVar32.inst,pvVar48);
    (RVar32.inst)->type = Number;
    ((RVar32.inst)->field_1).num = (double)IVar23;
LAB_00141fb5:
    target_05.str._M_str = (char *)RVar32.inst;
    target_05.str._M_len = sVar43;
    IVar59.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref>
                   ((ValueBuilder *)pMVar50,target_05,IVar59.str._M_str);
    break;
  case MemoryCopyId:
    pwVar51 = *(wasm2js **)((long)this + 0x20);
    puVar44 = &ABI::wasm2js::MEMORY_COPY;
    goto LAB_00141c05;
  case MemoryFillId:
    pwVar51 = *(wasm2js **)((long)this + 0x20);
    puVar44 = &ABI::wasm2js::MEMORY_FILL;
    goto LAB_00141c05;
  case RefNullId:
    pvVar48 = (void *)0x18;
    IVar59.str._M_str = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (IVar59.str._M_str)->type = Null;
    cashew::Value::free(IVar59.str._M_str,pvVar48);
    (IVar59.str._M_str)->type = String;
    ((IVar59.str._M_str)->field_1).str.str._M_len = sVar13;
    ((IVar59.str._M_str)->field_1).str.str._M_str = IVar63.str._M_str;
    break;
  case RefIsNullId:
    nextResult_27.str._M_str = (char *)cashew::RSHIFT;
    nextResult_27.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = IString_(this,*(Expression **)(curr + 1),nextResult_27);
    IVar63.str._M_str = UINT32ARRAY;
    sVar43 = NULL_;
    auVar61._8_8_ = cashew::BREAK;
    auVar61._0_8_ = cashew::EQ;
    pvVar48 = (void *)0x18;
    RVar32.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar32.inst)->type = Null;
    cashew::Value::free(RVar32.inst,pvVar48);
    (RVar32.inst)->type = String;
    ((RVar32.inst)->field_1).str.str._M_len = sVar43;
    ((RVar32.inst)->field_1).str.str._M_str = IVar63.str._M_str;
    goto LAB_00141b7f;
  case RefEqId:
    nextResult_02.str._M_str = (char *)cashew::RSHIFT;
    nextResult_02.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = IString_(this,*(Expression **)(curr + 1),nextResult_02);
    auVar61._8_8_ = cashew::BREAK;
    auVar61._0_8_ = cashew::EQ;
    nextResult_03.str._M_str = (char *)cashew::RSHIFT;
    nextResult_03.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_03);
    goto LAB_00141b7f;
  case TableGetId:
    pvVar48 = (void *)0x18;
    IVar59.str._M_str = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (IVar59.str._M_str)->type = Null;
    cashew::Value::free(IVar59.str._M_str,pvVar48);
    (IVar59.str._M_str)->type = String;
    ((IVar59.str._M_str)->field_1).str.str._M_len = sVar14;
    ((IVar59.str._M_str)->field_1).str.str._M_str = pcVar15;
    nextResult_28.str._M_str = (char *)cashew::RSHIFT;
    nextResult_28.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,*(Expression **)(curr + 2),nextResult_28);
    IVar59.str._M_str = cashew::ValueBuilder::makeSub(IVar59.str._M_str,RVar32);
    break;
  case TableSetId:
    pvVar48 = (void *)0x18;
    IVar59.str._M_str = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (IVar59.str._M_str)->type = Null;
    cashew::Value::free(IVar59.str._M_str,pvVar48);
    (IVar59.str._M_str)->type = String;
    ((IVar59.str._M_str)->field_1).str.str._M_len = sVar14;
    ((IVar59.str._M_str)->field_1).str.str._M_str = pcVar15;
    nextResult_11.str._M_str = (char *)cashew::RSHIFT;
    nextResult_11.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,*(Expression **)(curr + 2),nextResult_11);
    IVar59.str._M_str = cashew::ValueBuilder::makeSub(IVar59.str._M_str,RVar32);
    nextResult_12.str._M_str = (char *)cashew::RSHIFT;
    nextResult_12.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,(Expression *)curr[2].type.id,nextResult_12);
    auVar61._8_8_ = BLOCK;
    auVar61._0_8_ = cashew::SET;
    goto LAB_00141b7f;
  case TableSizeId:
    pvVar48 = (void *)0x18;
    IVar59.str._M_str = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (IVar59.str._M_str)->type = Null;
    cashew::Value::free(IVar59.str._M_str,pvVar48);
    (IVar59.str._M_str)->type = String;
    ((IVar59.str._M_str)->field_1).str.str._M_len = sVar14;
    ((IVar59.str._M_str)->field_1).str.str._M_str = pcVar15;
    IVar63.str._M_str = cashew::WHILE;
    sVar43 = LENGTH;
    pvVar48 = (void *)0x18;
    RVar32.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar32.inst)->type = Null;
    cashew::Value::free(RVar32.inst,pvVar48);
    (RVar32.inst)->type = String;
    ((RVar32.inst)->field_1).str.str._M_len = sVar43;
    ((RVar32.inst)->field_1).str.str._M_str = IVar63.str._M_str;
    IVar59.str._M_str = cashew::ValueBuilder::makeDot(IVar59.str._M_str,RVar32);
    break;
  case TableGrowId:
    IVar59.str._M_len = _getStruct;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TABLE_GROW,IVar59);
    specific.str._M_str = (char *)IVar59.str._M_str;
    specific.str._M_len = cashew::CALL;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TABLE_FILL,specific);
    sVar43 = _getStruct;
    pMVar50 = ABI::wasm2js::TABLE_GROW;
    nextResult_00.str._M_str = (char *)cashew::RSHIFT;
    nextResult_00.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = IString_(this,*(Expression **)(curr + 2),nextResult_00);
    nextResult_01.str._M_str = (char *)cashew::RSHIFT;
    nextResult_01.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,(Expression *)curr[2].type.id,nextResult_01);
LAB_00140b57:
    target.str._M_str = (char *)IVar59.str._M_str;
    target.str._M_len = sVar43;
    IVar59.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                   ((ValueBuilder *)pMVar50,target,RVar32,in_R8);
    break;
  case TableFillId:
    specific_01.str._M_str = (char *)IVar59.str._M_str;
    specific_01.str._M_len = cashew::CALL;
    ABI::wasm2js::ensureHelpers
              (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TABLE_FILL,specific_01);
    local_50.inst = (Value *)cashew::CALL;
    local_48.inst = (Value *)ABI::wasm2js::TABLE_FILL;
    nextResult_17.str._M_str = (char *)cashew::RSHIFT;
    nextResult_17.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = IString_(this,*(Expression **)(curr + 2),nextResult_17);
    nextResult_18.str._M_str = (char *)cashew::RSHIFT;
    nextResult_18.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,(Expression *)curr[2].type.id,nextResult_18);
    pEVar49 = *(Expression **)(curr + 3);
    goto LAB_00141c57;
  case TableCopyId:
    pwVar51 = *(wasm2js **)((long)this + 0x20);
    puVar44 = &ABI::wasm2js::TABLE_COPY;
LAB_00141c05:
    specific_05.str._M_str = (char *)IVar59.str._M_str;
    specific_05.str._M_len = puVar44[1];
    ABI::wasm2js::ensureHelpers(pwVar51,(Module *)*puVar44,specific_05);
    local_48.inst = (Value *)*puVar44;
    local_50.inst = (Value *)puVar44[1];
    nextResult_29.str._M_str = (char *)cashew::RSHIFT;
    nextResult_29.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = IString_(this,*(Expression **)(curr + 1),nextResult_29);
    nextResult_30.str._M_str = (char *)cashew::RSHIFT;
    nextResult_30.str._M_len = EXPRESSION_RESULT;
    RVar32 = IString_(this,(Expression *)curr[1].type.id,nextResult_30);
    pEVar49 = *(Expression **)(curr + 2);
LAB_00141c57:
    nextResult_31.str._M_str = (char *)cashew::RSHIFT;
    nextResult_31.str._M_len = EXPRESSION_RESULT;
    RVar33 = IString_(this,pEVar49,nextResult_31);
    target_04.str._M_str = (char *)IVar59.str._M_str;
    target_04.str._M_len = (size_t)local_50.inst;
    IVar59.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref>
                   (local_48.inst,target_04,RVar32,RVar33,in_R9);
    break;
  case RefAsId:
    if (*(int *)(curr + 1) != 0) {
      __assert_fail("curr->op == RefAsNonNull",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                    ,0x969,
                    "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitRefAs(RefAs *)"
                   );
    }
    specific_04.str._M_str = (char *)IVar59.str._M_str;
    specific_04.str._M_len = __M_create;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TRAP,specific_04);
    nextResult_23.str._M_str = (char *)cashew::RSHIFT;
    nextResult_23.str._M_len = EXPRESSION_RESULT;
    IVar59.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_23);
    auVar61 = ::wasm::IString::interned(2,"||",0);
    target_03.str._M_str = auVar61._8_8_;
    target_03.str._M_len = __M_create;
    RVar32 = cashew::ValueBuilder::makeCall((ValueBuilder *)ABI::wasm2js::TRAP,target_03);
    goto LAB_00141b7f;
  default:
    ::wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
               ,0x46);
  }
LAB_001425ba:
  *(Value **)((long)this + 8) = args_3.inst;
  *(size_t *)((long)this + 0x10) = old.str._M_len;
  return (Ref)IVar59.str._M_str;
}

Assistant:

Ref visit(Expression* curr, IString nextResult) {
      IString old = result;
      result = nextResult;
      Ref ret = OverriddenVisitor::visit(curr);
      // keep it consistent for the rest of this frame, which may call visit on
      // multiple children
      result = old;
      return ret;
    }